

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::setControlConstraintMatrix
          (LinearConstraint *this,MatrixDynSize *constraintMatrix)

{
  LinearConstraintImplementation *pLVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TimeInvariantObject<iDynTree::MatrixDynSize> *pTVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  size_t sVar4;
  size_t sVar5;
  string *psVar6;
  undefined1 local_39;
  TimeInvariantObject<iDynTree::MatrixDynSize> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  sVar4 = iDynTree::MatrixDynSize::rows();
  sVar5 = Constraint::constraintSize(&this->super_Constraint);
  if (sVar4 == sVar5) {
    local_38 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>,std::allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>>,iDynTree::MatrixDynSize_const&>
              (&_Stack_30,&local_38,
               (allocator<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::MatrixDynSize>_> *
               )&local_39,constraintMatrix);
    _Var3._M_pi = _Stack_30._M_pi;
    pTVar2 = local_38;
    pLVar1 = this->m_pimpl;
    local_38 = (TimeInvariantObject<iDynTree::MatrixDynSize> *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (pLVar1->controlConstraintMatrix).
              super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (pLVar1->controlConstraintMatrix).
    super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = &pTVar2->super_TimeVaryingObject<iDynTree::MatrixDynSize>;
    (pLVar1->controlConstraintMatrix).
    super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var3._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
      }
    }
    this->m_pimpl->constrainsControl = true;
  }
  else {
    psVar6 = Constraint::name_abi_cxx11_(&this->super_Constraint);
    iDynTree::reportError
              ((psVar6->_M_dataplus)._M_p,"setControlConstraintMatrix",
               "The number of rows of the constraintMatrix is different from the specified constraint size."
              );
  }
  return sVar4 == sVar5;
}

Assistant:

bool LinearConstraint::setControlConstraintMatrix(const MatrixDynSize &constraintMatrix)
        {
            if (constraintMatrix.rows() != constraintSize()) {
                reportError(name().c_str(), "setControlConstraintMatrix", "The number of rows of the constraintMatrix is different from the specified constraint size.");
                return false;
            }

            m_pimpl->controlConstraintMatrix = std::make_shared<TimeInvariantMatrix>(constraintMatrix);
            m_pimpl->constrainsControl = true;

            return true;
        }